

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

uint64_t __thiscall bloaty::RangeSink::TranslateFileToVM(RangeSink *this,char *ptr)

{
  char *pcVar1;
  bool bVar2;
  Nonnull<char_*> pcVar3;
  string_view format;
  uint64_t translated;
  Arg *in_stack_ffffffffffffff08;
  string local_f0;
  string local_d0;
  Arg local_b0;
  long local_80;
  Nonnull<char_*> local_78;
  char local_70 [32];
  Arg local_50;
  
  if (this->translator_ == (DualMap *)0x0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x54e,"uint64_t bloaty::RangeSink::TranslateFileToVM(const char *)");
  }
  pcVar1 = (this->file_->data_)._M_str;
  if ((pcVar1 <= ptr) && (ptr < pcVar1 + (this->file_->data_)._M_len)) {
    bVar2 = RangeMap::Translate(&this->translator_->file_map,(long)ptr - (long)pcVar1,
                                (uint64_t *)&stack0xffffffffffffff08);
    if (bVar2) {
      return (uint64_t)in_stack_ffffffffffffff08;
    }
  }
  pcVar3 = absl::numbers_internal::FastIntToBuffer((long)ptr - (long)pcVar1,local_70);
  local_80 = (long)pcVar3 - (long)local_70;
  pcVar1 = (this->file_->data_)._M_str;
  local_b0.piece_._M_str = "false";
  if (ptr < pcVar1 + (this->file_->data_)._M_len && pcVar1 <= ptr) {
    local_b0.piece_._M_str = "true";
  }
  local_b0.piece_._M_len = (ulong)(ptr < pcVar1 + (this->file_->data_)._M_len && pcVar1 <= ptr) ^ 5;
  local_78 = local_70;
  RangeMap::DebugString_abi_cxx11_(&local_d0,&this->translator_->file_map);
  local_50.piece_._M_len = 0;
  local_50.piece_._M_str = (char *)0x0;
  if (local_d0._M_dataplus._M_p != (char *)0x0) {
    local_50.piece_._M_len = strlen(local_d0._M_dataplus._M_p);
    local_50.piece_._M_str = local_d0._M_dataplus._M_p;
  }
  format._M_str = (char *)&local_80;
  format._M_len = (size_t)"Can\'t translate file offset ($0) to VM, contains: $1, map:\n$2";
  absl::Substitute_abi_cxx11_
            (&local_f0,(absl *)0x3d,format,&local_b0,&local_50,in_stack_ffffffffffffff08);
  Throw(local_f0._M_dataplus._M_p,0x555);
}

Assistant:

uint64_t RangeSink::TranslateFileToVM(const char* ptr) {
  assert(translator_);
  uint64_t offset = ptr - file_->data().data();
  uint64_t translated;
  if (!FileContainsPointer(ptr) ||
      !translator_->file_map.Translate(offset, &translated)) {
    THROWF("Can't translate file offset ($0) to VM, contains: $1, map:\n$2",
           offset, FileContainsPointer(ptr),
           translator_->file_map.DebugString().c_str());
  }
  return translated;
}